

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

QUnifiedTimer * QUnifiedTimer::instance(bool create)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  QUnifiedTimer *this;
  
  lVar3 = __tls_get_addr(&PTR_006a9338);
  if (*(char *)(lVar3 + 0x70) == '\0') {
    instance();
  }
  plVar1 = (long *)(lVar3 + 0x68);
  if ((create) && (*(long *)(lVar3 + 0x68) == 0)) {
    this = (QUnifiedTimer *)operator_new(0xd0);
    QUnifiedTimer((QUnifiedTimer *)this);
    plVar2 = (long *)*plVar1;
    *plVar1 = (long)this;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
  }
  else {
    this = (QUnifiedTimer *)*plVar1;
  }
  return this;
}

Assistant:

QUnifiedTimer *QUnifiedTimer::instance(bool create)
{
    QUnifiedTimer *inst;
    static thread_local std::unique_ptr<QUnifiedTimer> unifiedTimer;
    if (create && !unifiedTimer) {
        inst = new QUnifiedTimer;
        unifiedTimer.reset(inst);
    } else {
        inst = unifiedTimer.get();
    }
    return inst;
}